

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O1

bool cbtGjkEpaSolver2::Penetration
               (cbtConvexShape *shape0,cbtTransform *wtrs0,cbtConvexShape *shape1,
               cbtTransform *wtrs1,cbtVector3 *guess,sResults *results,bool usemargins)

{
  float fVar1;
  undefined1 auVar2 [16];
  _ _Var3;
  _ _Var4;
  code *pcVar5;
  long *plVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [12];
  tShape shape;
  GJK gjk;
  EPA epa;
  cbtVector3 local_7318;
  tShape local_7308;
  GJK local_7278;
  EPA local_70a8;
  undefined1 extraout_var [56];
  
  gjkepa2_impl::Initialize(shape0,wtrs0,shape1,wtrs1,results,&local_7308,usemargins);
  local_7278.m_nfree = 0;
  local_7278.m_current = 0;
  local_7278.m_ray.m_floats[0] = 0.0;
  local_7278.m_ray.m_floats[1] = 0.0;
  local_7278.m_ray.m_floats[2] = 0.0;
  local_7278.m_ray.m_floats[3] = 0.0;
  local_7278.m_status = Failed;
  local_7278.m_distance = 0.0;
  auVar8._0_4_ = -guess->m_floats[2];
  auVar8._4_4_ = 0x80000000;
  auVar8._8_4_ = 0x80000000;
  auVar8._12_4_ = 0x80000000;
  auVar10 = *(undefined1 (*) [16])guess->m_floats;
  auVar13._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
  auVar13._8_4_ = auVar10._8_4_ ^ 0x80000000;
  auVar13._12_4_ = auVar10._12_4_ ^ 0x80000000;
  local_70a8._0_16_ = vinsertps_avx(auVar13,auVar8,0x28);
  _Var3 = gjkepa2_impl::GJK::Evaluate(&local_7278,&local_7308,(cbtVector3 *)&local_70a8);
  if (_Var3 == Failed) {
    results->status = GJK_Failed;
  }
  else if (_Var3 == Inside) {
    local_70a8.m_hull.root = (sFace *)0x0;
    local_70a8.m_hull.count = 0;
    local_70a8.m_stock.root = (sFace *)0x0;
    local_70a8.m_stock.count = 0;
    gjkepa2_impl::EPA::Initialize(&local_70a8);
    auVar9._0_4_ = -guess->m_floats[2];
    auVar9._4_4_ = 0x80000000;
    auVar9._8_4_ = 0x80000000;
    auVar9._12_4_ = 0x80000000;
    auVar10 = *(undefined1 (*) [16])guess->m_floats;
    auVar14._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
    auVar14._8_4_ = auVar10._8_4_ ^ 0x80000000;
    auVar14._12_4_ = auVar10._12_4_ ^ 0x80000000;
    local_7318.m_floats = (cbtScalar  [4])vinsertps_avx(auVar14,auVar9,0x28);
    _Var4 = gjkepa2_impl::EPA::Evaluate(&local_70a8,&local_7278,&local_7318);
    if (_Var4 == Failed) {
      results->status = EPA_Failed;
    }
    else {
      if (local_70a8.m_result.rank == 0) {
        auVar8 = ZEXT816(0);
        fVar18 = 0.0;
        auVar10 = ZEXT816(0);
      }
      else {
        fVar17 = 0.0;
        uVar7 = 0;
        fVar18 = 0.0;
        fVar19 = 0.0;
        do {
          plVar6 = (long *)((long)&(local_7308.m_shapes[0]->super_cbtCollisionShape).
                                   _vptr_cbtCollisionShape + local_7308._136_8_);
          pcVar5 = (code *)local_7308.Ls;
          if ((local_7308.Ls & 1) != 0) {
            pcVar5 = *(code **)(local_7308.Ls + *plVar6 + -1);
          }
          auVar20 = (*pcVar5)(plVar6,*(undefined8 *)
                                      ((long)*(undefined1 (*) [16])&local_70a8 + uVar7 * 8 + 8));
          auVar12._0_8_ = auVar20._0_8_;
          auVar12._8_56_ = extraout_var;
          fVar1 = *(float *)((long)((undefined1 (*) [16])&local_70a8 + 2) + 8U + uVar7 * 4);
          fVar19 = fVar19 + fVar1 * auVar20._0_4_;
          auVar8 = ZEXT416((uint)fVar19);
          auVar10 = vmovshdup_avx(auVar12._0_16_);
          fVar18 = fVar18 + fVar1 * auVar10._0_4_;
          fVar17 = fVar17 + fVar1 * auVar20._8_4_;
          auVar10 = ZEXT416((uint)fVar17);
          uVar7 = uVar7 + 1;
        } while (uVar7 < local_70a8.m_result.rank);
      }
      results->status = Penetrating;
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * (wtrs0->m_basis).m_el[0].m_floats[1])),
                                auVar8,ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[0]));
      auVar13 = vfmadd231ss_fma(auVar13,auVar10,ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[2]))
      ;
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * (wtrs0->m_basis).m_el[1].m_floats[1])),auVar8
                               ,ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[0]));
      auVar9 = vfmadd231ss_fma(auVar9,auVar10,ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[2]));
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * (wtrs0->m_basis).m_el[2].m_floats[1])),
                                auVar8,ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[0]));
      auVar14 = vfmadd231ss_fma(auVar14,auVar10,ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[2]))
      ;
      auVar13 = vinsertps_avx(ZEXT416((uint)(auVar13._0_4_ + (wtrs0->m_origin).m_floats[0])),
                              ZEXT416((uint)(auVar9._0_4_ + (wtrs0->m_origin).m_floats[1])),0x10);
      auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)(auVar14._0_4_ + (wtrs0->m_origin).m_floats[2]))
                              ,0x28);
      *(undefined1 (*) [16])results->witnesses[0].m_floats = auVar13;
      fVar19 = auVar8._0_4_ - local_70a8.m_depth * local_70a8.m_normal.m_floats[0];
      fVar18 = fVar18 - local_70a8.m_depth * local_70a8.m_normal.m_floats[1];
      fVar17 = auVar10._0_4_ - local_70a8.m_depth * local_70a8.m_normal.m_floats[2];
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * (wtrs0->m_basis).m_el[0].m_floats[1])),
                                ZEXT416((uint)fVar19),
                                ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[0]));
      auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar17),
                                ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[2]));
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * (wtrs0->m_basis).m_el[1].m_floats[1])),
                               ZEXT416((uint)fVar19),
                               ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[0]));
      auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar17),
                               ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[2]));
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * (wtrs0->m_basis).m_el[2].m_floats[1])),
                                ZEXT416((uint)fVar19),
                                ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[0]));
      auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar17),
                                ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[2]));
      auVar10 = vinsertps_avx(ZEXT416((uint)(auVar10._0_4_ + (wtrs0->m_origin).m_floats[0])),
                              ZEXT416((uint)(auVar8._0_4_ + (wtrs0->m_origin).m_floats[1])),0x10);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
      auVar20 = SUB1612(auVar2 << 0x40,4);
      auVar16._20_12_ = auVar20;
      auVar16._16_4_ = auVar13._0_4_ + (wtrs0->m_origin).m_floats[2];
      auVar15._24_4_ = -local_70a8.m_normal.m_floats[2];
      auVar15._16_8_ =
           CONCAT44(local_70a8.m_normal.m_floats[1],local_70a8.m_normal.m_floats[0]) ^
           0x8000000080000000;
      auVar15._28_4_ = -local_70a8.m_normal.m_floats[3];
      auVar15._0_16_ = auVar10;
      auVar16._0_16_ = ZEXT416((uint)local_70a8.m_normal.m_floats[2]);
      auVar10._0_4_ = -local_70a8.m_normal.m_floats[2];
      auVar10._4_12_ = auVar20;
      auVar11._16_16_ = auVar10;
      auVar11._0_16_ = auVar10;
      auVar11 = vperm2f128_avx(auVar16,auVar11,0x31);
      auVar11 = vunpcklpd_avx(auVar15,auVar11);
      *(undefined1 (*) [32])(results->witnesses + 1) = auVar11;
      results->distance = -local_70a8.m_depth;
    }
    if (_Var4 != Failed) {
      return true;
    }
  }
  return false;
}

Assistant:

bool cbtGjkEpaSolver2::Penetration(const cbtConvexShape* shape0,
								  const cbtTransform& wtrs0,
								  const cbtConvexShape* shape1,
								  const cbtTransform& wtrs1,
								  const cbtVector3& guess,
								  sResults& results,
								  bool usemargins)
{
	tShape shape;
	Initialize(shape0, wtrs0, shape1, wtrs1, results, shape, usemargins);
	GJK gjk;
	GJK::eStatus::_ gjk_status = gjk.Evaluate(shape, -guess);
	switch (gjk_status)
	{
		case GJK::eStatus::Inside:
		{
			EPA epa;
			EPA::eStatus::_ epa_status = epa.Evaluate(gjk, -guess);
			if (epa_status != EPA::eStatus::Failed)
			{
				cbtVector3 w0 = cbtVector3(0, 0, 0);
				for (U i = 0; i < epa.m_result.rank; ++i)
				{
					w0 += shape.Support(epa.m_result.c[i]->d, 0) * epa.m_result.p[i];
				}
				results.status = sResults::Penetrating;
				results.witnesses[0] = wtrs0 * w0;
				results.witnesses[1] = wtrs0 * (w0 - epa.m_normal * epa.m_depth);
				results.normal = -epa.m_normal;
				results.distance = -epa.m_depth;
				return (true);
			}
			else
				results.status = sResults::EPA_Failed;
		}
		break;
		case GJK::eStatus::Failed:
			results.status = sResults::GJK_Failed;
			break;
		default:
		{
		}
	}
	return (false);
}